

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void usageMessage(ostream *stream,char *program_name,bool verbose)

{
  ostream *poVar1;
  char *pcVar2;
  byte in_DL;
  char *in_RSI;
  ostream *in_RDI;
  string compressionNames;
  allocator<char> local_59;
  string local_58 [8];
  allocator<char> *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  string local_38 [39];
  byte local_11;
  char *local_10;
  ostream *local_8;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  poVar1 = std::operator<<(in_RDI,"Usage: ");
  poVar1 = std::operator<<(poVar1,local_10);
  poVar1 = std::operator<<(poVar1," [options] infile outfile");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if ((local_11 & 1) != 0) {
    std::__cxx11::string::string(local_38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0
              );
    Imf_3_3::getCompressionNamesString(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator(&local_59);
    poVar1 = std::operator<<(local_8,
                             "Read an OpenEXR image from infile, write an identical copy to outfile reporting time taken to read/write and file sizes.\n\nOptions:\n\n  -p n          part number to copy (only one part will be written to output file)\n                default is part 0\n\n  -l level      set DWA or ZIP compression level\n\n  -z x          sets the data compression method to x\n                ("
                            );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::operator<<(poVar1,
                    ",\n                default retains original method)\n\n  -16 rgba|all  force 16 bit half float: either just RGBA, or all channels\n                default retains original type for all channels\n\n  -h, --help    print this message\n\n      --version print version information\n\n"
                   );
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void
usageMessage (ostream& stream, const char* program_name, bool verbose = false)
{
    stream << "Usage: " << program_name << " [options] infile outfile" << endl;

    if (verbose)
    {
        std::string compressionNames;
        getCompressionNamesString ("/", compressionNames);
        stream
            << "Read an OpenEXR image from infile, write an identical copy to outfile"
               " reporting time taken to read/write and file sizes.\n"
               "\n"
               "Options:\n"
               "\n"
               "  -p n          part number to copy (only one part will be written to output file)\n"
               "                default is part 0\n"
               "\n"
               "  -l level      set DWA or ZIP compression level\n"
               "\n"
               "  -z x          sets the data compression method to x\n"
               "                ("
            << compressionNames.c_str ()
            << ",\n"
               "                default retains original method)\n"
               "\n"
               "  -16 rgba|all  force 16 bit half float: either just RGBA, or all channels\n"
               "                default retains original type for all channels\n"
               "\n"
               "  -h, --help    print this message\n"
               "\n"
               "      --version print version information\n"
               "\n";
    }
}